

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall Nova::Driver<float,_1>::Write_Time(Driver<float,_1> *this,int frame)

{
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this->example->write_time == true) {
    std::operator+(&local_70,&this->example->output_directory,"/");
    std::__cxx11::to_string(&local_90,frame);
    std::operator+(&local_50,&local_70,&local_90);
    std::operator+(&local_30,&local_50,"/time");
    File_Utilities::Write_To_File<float>(&local_30,&this->time);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void Driver<T,d>::
Write_Time(const int frame) const
{
    if(example.write_time) File_Utilities::Write_To_File<T>(example.output_directory+"/"+std::to_string(frame)+"/time",time);
}